

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O0

void __thiscall
StaticSynapse::StaticSynapse
          (StaticSynapse *this,Population *n_from,Population *n_to,StaticSynapse_param *param)

{
  StaticSynapse *in_RCX;
  Synapse *in_RDI;
  Population *in_stack_ffffffffffffffd0;
  Population *in_stack_ffffffffffffffd8;
  
  Synapse::Synapse(in_RDI);
  in_RDI->_vptr_Synapse = (_func_int **)&PTR_update_00127d20;
  in_RDI[1]._vptr_Synapse = (_func_int **)in_RCX;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffffd0);
  initialize(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

StaticSynapse::StaticSynapse(Population* n_from, Population* n_to, StaticSynapse_param* param) : 
    param(param)
{
    initialize(n_from, n_to);
}